

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O1

bool clusterG(TSimilarityMap *sim,TKeyPressCollection *keyPresses)

{
  pointer pvVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer psVar8;
  undefined1 (*pauVar9) [16];
  int iVar10;
  TClusterId *ck;
  ulong uVar11;
  ulong uVar12;
  TClusterId *pTVar13;
  int iVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [16];
  int iVar17;
  long lVar18;
  undefined1 (*pauVar19) [16];
  undefined1 (*pauVar20) [16];
  __normal_iterator<Pair_*,_std::vector<Pair,_std::allocator<Pair>_>_> __i;
  undefined1 (*pauVar21) [16];
  undefined1 (*pauVar22) [16];
  uint uVar23;
  ulong uVar24;
  int q;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  ulong uVar29;
  undefined8 *puVar30;
  double dVar31;
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  auVar36 = _DAT_00115030;
  psVar8 = (keyPresses->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
           ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar24 = ((long)(keyPresses->
                  super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4) *
           -0x5555555555555555;
  uVar23 = (uint)uVar24;
  if (0 < (int)uVar23) {
    uVar15 = (ulong)(uVar23 + 1 & 0xfffffffe);
    lVar18 = (ulong)(uVar23 & 0x7fffffff) - 1;
    auVar32._8_4_ = (int)lVar18;
    auVar32._0_8_ = lVar18;
    auVar32._12_4_ = (int)((ulong)lVar18 >> 0x20);
    pTVar13 = &psVar8[1].cid;
    auVar32 = auVar32 ^ _DAT_00115030;
    auVar34 = _DAT_00115020;
    do {
      auVar37 = auVar34 ^ auVar36;
      lVar18 = auVar34._8_8_;
      if ((bool)(~(auVar37._4_4_ == auVar32._4_4_ && auVar32._0_4_ < auVar37._0_4_ ||
                  auVar32._4_4_ < auVar37._4_4_) & 1)) {
        pTVar13[-0xc] = (int)(auVar34._0_8_ + 1);
      }
      if ((auVar37._12_4_ != auVar32._12_4_ || auVar37._8_4_ <= auVar32._8_4_) &&
          auVar37._12_4_ <= auVar32._12_4_) {
        *pTVar13 = (TClusterId)(lVar18 + 1);
      }
      auVar34._0_8_ = auVar34._0_8_ + 2;
      auVar34._8_8_ = lVar18 + 2;
      pTVar13 = pTVar13 + 0x18;
      uVar15 = uVar15 - 2;
    } while (uVar15 != 0);
  }
  pauVar28 = (undefined1 (*) [16])0x0;
  pauVar20 = (undefined1 (*) [16])0x0;
  pauVar21 = (undefined1 (*) [16])0x0;
  if (1 < (int)uVar23) {
    uVar25 = 1;
    pauVar21 = (undefined1 (*) [16])0x0;
    pauVar20 = (undefined1 (*) [16])0x0;
    pauVar28 = (undefined1 (*) [16])0x0;
    uVar15 = 0;
    do {
      uVar11 = uVar15 + 1;
      pauVar22 = pauVar21;
      uVar26 = uVar25;
      do {
        uVar3 = *(undefined8 *)
                 (*(long *)&(sim->
                            super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar15].
                            super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                            super__Vector_impl_data + uVar26 * 0x10);
        if (pauVar20 == pauVar28) {
          if ((long)pauVar20 - (long)pauVar22 == 0x7ffffffffffffff0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar27 = (long)pauVar20 - (long)pauVar22 >> 4;
          uVar12 = uVar27;
          if (pauVar20 == pauVar22) {
            uVar12 = 1;
          }
          uVar29 = uVar12 + uVar27;
          if (0x7fffffffffffffe < uVar29) {
            uVar29 = 0x7ffffffffffffff;
          }
          if (CARRY8(uVar12,uVar27)) {
            uVar29 = 0x7ffffffffffffff;
          }
          if (uVar29 == 0) {
            pauVar21 = (undefined1 (*) [16])0x0;
          }
          else {
            pauVar21 = (undefined1 (*) [16])operator_new(uVar29 << 4);
          }
          *(int *)pauVar21[uVar27] = (int)uVar15;
          *(int *)(pauVar21[uVar27] + 4) = (int)uVar26;
          *(undefined8 *)(pauVar21[uVar27] + 8) = uVar3;
          pauVar16 = pauVar21;
          for (pauVar19 = pauVar22; pauVar20 != pauVar19; pauVar19 = pauVar19 + 1) {
            uVar3 = *(undefined8 *)(*pauVar19 + 8);
            *(undefined8 *)*pauVar16 = *(undefined8 *)*pauVar19;
            *(undefined8 *)(*pauVar16 + 8) = uVar3;
            pauVar16 = pauVar16 + 1;
          }
          if (pauVar22 != (undefined1 (*) [16])0x0) {
            operator_delete(pauVar22,(long)pauVar28 - (long)pauVar22);
          }
          pauVar28 = pauVar21 + uVar29;
        }
        else {
          *(int *)*pauVar20 = (int)uVar15;
          *(int *)(*pauVar20 + 4) = (int)uVar26;
          *(undefined8 *)(*pauVar20 + 8) = uVar3;
          pauVar16 = pauVar20;
          pauVar21 = pauVar22;
        }
        pauVar20 = pauVar16 + 1;
        uVar26 = uVar26 + 1;
        pauVar22 = pauVar21;
      } while (uVar26 != (uVar23 & 0x7fffffff));
      uVar25 = uVar25 + 1;
      uVar15 = uVar11;
    } while (uVar11 != uVar23 - 1);
  }
  if (pauVar21 != pauVar20) {
    uVar15 = (long)pauVar20 - (long)pauVar21 >> 4;
    lVar18 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pauVar21,pauVar20,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pauVar20 - (long)pauVar21 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pauVar21,pauVar20);
    }
    else {
      pauVar22 = pauVar21 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pauVar21,pauVar22);
      for (; pauVar22 != pauVar20; pauVar22 = pauVar22 + 1) {
        uVar3 = *(undefined8 *)*pauVar22;
        dVar31 = *(double *)(*pauVar22 + 8);
        pauVar16 = pauVar22;
        pauVar19 = pauVar22;
        if (*(double *)(pauVar22[-1] + 8) <= dVar31 && dVar31 != *(double *)(pauVar22[-1] + 8)) {
          do {
            pauVar16 = pauVar19 + -1;
            *pauVar19 = pauVar19[-1];
            pauVar9 = pauVar19 + -2;
            pauVar19 = pauVar16;
          } while (*(double *)(*pauVar9 + 8) <= dVar31 && dVar31 != *(double *)(*pauVar9 + 8));
        }
        *(undefined8 *)*pauVar16 = uVar3;
        *(double *)(*pauVar16 + 8) = dVar31;
      }
    }
  }
  puts("[+] Top 10 pairs");
  puVar30 = (undefined8 *)(*pauVar21 + 8);
  uVar15 = 0;
  do {
    printf("    Pair %d: %d %d %g\n",*puVar30,uVar15 & 0xffffffff,(ulong)*(uint *)(puVar30 + -1),
           (ulong)*(uint *)((long)puVar30 + -4));
    uVar15 = uVar15 + 1;
    puVar30 = puVar30 + 2;
  } while (uVar15 != 10);
  uVar15 = (ulong)((long)pauVar20 - (long)pauVar21) >> 4;
  if (0 < (int)uVar15) {
    uVar24 = uVar24 & 0x7fffffff;
    uVar25 = 0;
    do {
      iVar10 = 0xe;
      if (0.5 < *(double *)(pauVar21[uVar25] + 8) || *(double *)(pauVar21[uVar25] + 8) == 0.5) {
        pauVar20 = pauVar21 + uVar25;
        psVar8 = (keyPresses->
                 super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                 super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar4 = psVar8[*(int *)*pauVar20].cid;
        iVar5 = psVar8[*(int *)(*pauVar20 + 4)].cid;
        iVar10 = 0;
        if (iVar4 != iVar5) {
          iVar10 = iVar4;
          if (iVar5 < iVar4) {
            iVar10 = iVar5;
          }
          if ((int)uVar23 < 1) {
            iVar2 = 0;
            dVar31 = 0.0;
            iVar17 = 0;
            iVar14 = 0;
            dVar33 = 0.0;
            dVar35 = 0.0;
          }
          else {
            uVar26 = 0;
            auVar36 = (undefined1  [16])0x0;
            dVar33 = 0.0;
            dVar31 = 0.0;
            iVar14 = 0;
            iVar17 = 0;
            iVar2 = 0;
            do {
              pvVar1 = (sim->
                       super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar26;
              iVar6 = psVar8[uVar26].cid;
              lVar18 = 0;
              uVar11 = 0;
              pTVar13 = &psVar8->cid;
              do {
                if (uVar26 != uVar11) {
                  iVar7 = *pTVar13;
                  if ((iVar6 == iVar5 || iVar6 == iVar4) && ((iVar7 == iVar4 || (iVar7 == iVar5))))
                  {
                    dVar31 = dVar31 + *(double *)
                                       (*(long *)&(pvVar1->
                                                  super__Vector_base<stMatch,_std::allocator<stMatch>_>
                                                  )._M_impl.super__Vector_impl_data + lVar18);
                    iVar2 = iVar2 + 1;
                  }
                  if (iVar7 == iVar4 && iVar6 == iVar4) {
                    dVar33 = dVar33 + *(double *)
                                       (*(long *)&(pvVar1->
                                                  super__Vector_base<stMatch,_std::allocator<stMatch>_>
                                                  )._M_impl.super__Vector_impl_data + lVar18);
                    iVar17 = iVar17 + 1;
                  }
                  if (iVar7 == iVar5 && iVar6 == iVar5) {
                    auVar36._0_8_ =
                         auVar36._0_8_ +
                         *(double *)
                          (*(long *)&(pvVar1->super__Vector_base<stMatch,_std::allocator<stMatch>_>)
                                     ._M_impl.super__Vector_impl_data + lVar18);
                    iVar14 = iVar14 + 1;
                  }
                }
                dVar35 = auVar36._0_8_;
                uVar11 = uVar11 + 1;
                lVar18 = lVar18 + 0x10;
                pTVar13 = pTVar13 + 0xc;
              } while (uVar24 != uVar11);
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar24);
          }
          if (0 < iVar17) {
            dVar33 = dVar33 / (double)iVar17;
          }
          if (0 < iVar14) {
            dVar35 = dVar35 / (double)iVar14;
          }
          printf("Merge avg n = %4d, cc = %8.5f, ni = %4d, cci = %8.5f, nj = %4d, ccj = %8.5f\n");
          if (dVar31 / (double)iVar2 <= (dVar33 + dVar35) * 0.4) {
            iVar10 = 0;
          }
          else {
            if (0 < (int)uVar23) {
              pTVar13 = &((keyPresses->
                          super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                          ).
                          super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->cid;
              uVar26 = uVar24;
              do {
                if ((*pTVar13 == iVar4) || (*pTVar13 == iVar5)) {
                  *pTVar13 = iVar10;
                }
                pTVar13 = pTVar13 + 0xc;
                uVar26 = uVar26 - 1;
              } while (uVar26 != 0);
            }
            printf("Clusters %3d %5.4f:",*(undefined8 *)(*pauVar20 + 8));
            if (0 < (int)uVar23) {
              lVar18 = 0x20;
              uVar26 = uVar24;
              do {
                printf(" %3d",(ulong)*(uint *)((long)&(((keyPresses->
                                                                                                                
                                                  super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                                  ).
                                                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  waveform).samples + lVar18));
                lVar18 = lVar18 + 0x30;
                uVar26 = uVar26 - 1;
              } while (uVar26 != 0);
            }
            putchar(10);
            iVar10 = 0;
          }
        }
      }
    } while ((iVar10 == 0) && (uVar25 = uVar25 + 1, uVar25 != (uVar15 & 0x7fffffff)));
  }
  if (pauVar21 != (undefined1 (*) [16])0x0) {
    operator_delete(pauVar21,(long)pauVar28 - (long)pauVar21);
  }
  return true;
}

Assistant:

bool clusterG(const TSimilarityMap & sim, TKeyPressCollection & keyPresses) {
    struct Pair {
        int i = -1;
        int j = -1;
        TValueCC cc = -1.0;

        bool operator < (const Pair & a) const { return cc > a.cc; }
    };

    int n = keyPresses.size();

    int nclusters = 0;
    for (int i = 0; i < n; ++i) {
        auto & ci = keyPresses[i].cid;

        ci = i + 1;
        ++nclusters;
    }

    std::vector<Pair> ccpairs;
    for (int i = 0; i < n - 1; ++i) {
        for (int j = i + 1; j < n; ++j) {
            auto & cc = sim[i][j].cc;

            ccpairs.emplace_back(Pair{i, j, cc});
        }
    }

    std::sort(ccpairs.begin(), ccpairs.end());

    printf("[+] Top 10 pairs\n");
    for (int i = 0; i < 10; ++i) {
        printf("    Pair %d: %d %d %g\n", i, ccpairs[i].i, ccpairs[i].j, ccpairs[i].cc);
    }

    int npairs = ccpairs.size();
    for (int ip = 0; ip < npairs; ++ip) {
        auto & curpair = ccpairs[ip];
        //if (frand() > curpair.cc) continue;
        if (curpair.cc < 0.50) break;

        auto ci = keyPresses[curpair.i].cid;
        auto cj = keyPresses[curpair.j].cid;

        if (ci == cj) continue;
        auto cnew = std::min(ci, cj);
        int nsum = 0;
        int nsumi = 0;
        int nsumj = 0;
        double sumcc = 0.0;
        double sumcci = 0.0;
        double sumccj = 0.0;
        for (int k = 0; k < n; ++k) {
            auto ck = keyPresses[k].cid;

            for (int q = 0; q < n; ++q) {
                if (q == k) continue;
                auto cq = keyPresses[q].cid;

                if ((ck == ci || ck == cj) && (cq == ci || cq == cj)) {
                    auto & cc     = sim[k][q].cc;
                    //auto & offset = sim[k][q].offset;

                    sumcc += cc;
                    ++nsum;
                }
                if (ck == ci && cq == ci) {
                    auto & cc     = sim[k][q].cc;
                    //auto & offset = sim[k][q].offset;

                    sumcci += cc;
                    ++nsumi;
                }
                if (ck == cj && cq == cj) {
                    auto & cc     = sim[k][q].cc;
                    //auto & offset = sim[k][q].offset;

                    sumccj += cc;
                    ++nsumj;
                }
            }
        }
        sumcc /= nsum;
        if (nsumi > 0) sumcci /= nsumi;
        if (nsumj > 0) sumccj /= nsumj;
        printf("Merge avg n = %4d, cc = %8.5f, ni = %4d, cci = %8.5f, nj = %4d, ccj = %8.5f\n", nsum, sumcc, nsumi, sumcci, nsumj, sumccj);

        //if (sumcc < 1.000*curpair.cc) continue;
        //if (sumcc > 0.75*sumccj && sumcc > 0.75*sumcci) {
        if (sumcc > 0.4*(sumcci + sumccj)) {
        } else {
            continue;
        }

        for (int k = 0; k < n; ++k) {
            auto & ck = keyPresses[k].cid;

            if (ck == ci || ck == cj) ck = cnew;
        }
        --nclusters;

        printf("Clusters %3d %5.4f:", nclusters, curpair.cc);
        for (int k = 0; k < n; ++k) {
            auto & ck = keyPresses[k].cid;

            printf(" %3d", ck);
        }
        printf("\n");
    }

    return true;
}